

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowbase.h
# Opt level: O1

void __thiscall soplex::LPRowBase<double>::LPRowBase(LPRowBase<double> *this,int defDim)

{
  double *pdVar1;
  int n;
  
  this->left = 0.0;
  ::soplex::infinity::__tls_init();
  pdVar1 = (double *)__tls_get_addr(&PTR_003b6b60);
  this->right = *pdVar1;
  this->object = 0.0;
  (this->vec).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->vec).super_SVectorBase<double>.memsize = 0;
  (this->vec).super_SVectorBase<double>.memused = 0;
  (this->vec)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
  (this->vec).theelem = (Nonzero<double> *)0x0;
  n = 2;
  if (0 < defDim) {
    n = defDim;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->vec).theelem,n);
  (this->vec).super_SVectorBase<double>.m_elem = (this->vec).theelem;
  (this->vec).super_SVectorBase<double>.memused = 0;
  (this->vec).super_SVectorBase<double>.memsize = n;
  return;
}

Assistant:

explicit LPRowBase(int defDim = 0)
      : left(0), right(R(infinity)), object(0), vec(defDim)
   {
      assert(isConsistent());
   }